

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O1

void delete_detection_node(coda_detection_node *node)

{
  long lVar1;
  
  if (node->path != (char *)0x0) {
    free(node->path);
  }
  if (node->subnode != (coda_detection_node_struct **)0x0) {
    if (0 < node->num_subnodes) {
      lVar1 = 0;
      do {
        delete_detection_node(node->subnode[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < node->num_subnodes);
    }
    free(node->subnode);
  }
  free(node);
  return;
}

Assistant:

static void delete_detection_node(coda_detection_node *node)
{
    int i;

    if (node->path != NULL)
    {
        free(node->path);
    }
    if (node->subnode != NULL)
    {
        for (i = 0; i < node->num_subnodes; i++)
        {
            delete_detection_node(node->subnode[i]);
        }
        free(node->subnode);
    }
    free(node);
}